

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDSectorType::SectorFaceCountFromEdgeCount
               (ON_SubDVertexTag vertex_tag,uint sector_edge_count)

{
  if (sector_edge_count - 2 < 0xffef) {
    return sector_edge_count - ((vertex_tag & ~Smooth) == Crease);
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::SectorFaceCountFromEdgeCount(
  ON_SubDVertexTag vertex_tag,
  unsigned int sector_edge_count
  )
{
  if (sector_edge_count >= 2 && sector_edge_count <= ON_SubDVertex::MaximumEdgeCount)
  {
    unsigned int sector_face_count
      = (ON_SubDVertexTag::Crease == vertex_tag || ON_SubDVertexTag::Corner == vertex_tag)
      ? sector_edge_count-1
      : sector_edge_count;
    return sector_face_count;
  }
  return ON_SUBD_RETURN_ERROR(0);
}